

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeMapIteratorPrototype
               (DynamicObject *mapIteratorPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  bool bVar1;
  JavascriptLibrary *this;
  ScriptContext *this_00;
  ScriptConfiguration *this_01;
  JavascriptString *value;
  ScriptContext *scriptContext;
  JavascriptLibrary *library;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *mapIteratorPrototype_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,mapIteratorPrototype,mode,2,0);
  this = RecyclableObject::GetLibrary(&mapIteratorPrototype->super_RecyclableObject);
  this_00 = GetScriptContext(this);
  AddFunctionToLibraryObject
            (this,mapIteratorPrototype,0x107,(FunctionInfo *)JavascriptMapIterator::EntryInfo::Next,
             0,'\x06');
  this_01 = ScriptContext::GetConfig(this_00);
  bVar1 = ScriptConfiguration::IsES6ToStringTagEnabled(this_01);
  if (bVar1) {
    value = CreateStringFromCppLiteral<13ul>(this,(char16 (*) [13])L"Map Iterator");
    AddMember(this,mapIteratorPrototype,0x1b,value,'\x02');
  }
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeMapIteratorPrototype(DynamicObject* mapIteratorPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(mapIteratorPrototype, mode, 2);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterMapIterator
        // so that the update is in sync with profiler

        JavascriptLibrary* library = mapIteratorPrototype->GetLibrary();
        ScriptContext* scriptContext = library->GetScriptContext();

        library->AddFunctionToLibraryObject(mapIteratorPrototype, PropertyIds::next, &JavascriptMapIterator::EntryInfo::Next, 0);

        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(mapIteratorPrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("Map Iterator")), PropertyConfigurable);
        }

        return true;
    }